

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

bool __thiscall
kj::MainBuilder::Impl::OptionDisplayOrder::operator()(OptionDisplayOrder *this,Option *a,Option *b)

{
  OptionName *pOVar1;
  size_t sVar2;
  OptionName *pOVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char cVar8;
  char *__s;
  char cVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong __n;
  char *__s_00;
  
  if (a == b) {
    return false;
  }
  pOVar1 = (a->names).ptr;
  sVar2 = (a->names).size_;
  if (sVar2 == 0) {
    cVar9 = '\0';
  }
  else {
    lVar10 = 0;
    cVar9 = '\0';
    do {
      if ((&pOVar1->isLong)[lVar10] != true) {
        cVar9 = *(char *)((long)&pOVar1->field_1 + lVar10);
        break;
      }
      if (cVar9 == '\0') {
        cVar9 = **(char **)((long)&pOVar1->field_1 + lVar10);
      }
      lVar10 = lVar10 + 0x10;
    } while (sVar2 << 4 != lVar10);
  }
  pOVar3 = (b->names).ptr;
  sVar4 = (b->names).size_;
  if (sVar4 == 0) {
    cVar8 = '\0';
  }
  else {
    lVar10 = 0;
    cVar8 = '\0';
    do {
      if ((&pOVar3->isLong)[lVar10] != true) {
        cVar8 = *(char *)((long)&pOVar3->field_1 + lVar10);
        break;
      }
      if (cVar8 == '\0') {
        cVar8 = **(char **)((long)&pOVar3->field_1 + lVar10);
      }
      lVar10 = lVar10 + 0x10;
    } while (sVar4 << 4 != lVar10);
  }
  bVar5 = true;
  if (cVar8 <= cVar9) {
    if (cVar8 < cVar9) {
      bVar5 = false;
    }
    else {
      uVar12 = 1;
      __s = "";
      __s_00 = "";
      uVar11 = 1;
      if (sVar2 != 0) {
        lVar10 = 0;
        do {
          if ((&pOVar1->isLong)[lVar10] == true) {
            __s_00 = *(char **)((long)&pOVar1->field_1 + lVar10);
            sVar7 = strlen(__s_00);
            uVar11 = sVar7 + 1;
            goto LAB_00288c08;
          }
          lVar10 = lVar10 + 0x10;
        } while (sVar2 << 4 != lVar10);
        __s_00 = "";
        uVar11 = 1;
      }
LAB_00288c08:
      if (sVar4 != 0) {
        lVar10 = 0;
        do {
          if ((&pOVar3->isLong)[lVar10] == true) {
            __s = *(char **)((long)&pOVar3->field_1 + lVar10);
            sVar7 = strlen(__s);
            uVar12 = sVar7 + 1;
            break;
          }
          lVar10 = lVar10 + 0x10;
        } while (sVar4 << 4 != lVar10);
      }
      __n = uVar12;
      if (uVar11 < uVar12) {
        __n = uVar11;
      }
      iVar6 = memcmp(__s_00,__s,__n);
      bVar5 = iVar6 < 0;
      if (iVar6 == 0) {
        bVar5 = uVar11 < uVar12;
      }
    }
  }
  return bVar5;
}

Assistant:

bool operator()(const Option* a, const Option* b) const {
    if (a == b) return false;

    char aShort = '\0';
    char bShort = '\0';

    for (auto& name: a->names) {
      if (name.isLong) {
        if (aShort == '\0') {
          aShort = name.longName[0];
        }
      } else {
        aShort = name.shortName;
        break;
      }
    }
    for (auto& name: b->names) {
      if (name.isLong) {
        if (bShort == '\0') {
          bShort = name.longName[0];
        }
      } else {
        bShort = name.shortName;
        break;
      }
    }

    if (aShort < bShort) return true;
    if (aShort > bShort) return false;

    StringPtr aLong;
    StringPtr bLong;

    for (auto& name: a->names) {
      if (name.isLong) {
        aLong = name.longName;
        break;
      }
    }
    for (auto& name: b->names) {
      if (name.isLong) {
        bLong = name.longName;
        break;
      }
    }

    return aLong < bLong;
  }